

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
MineBanIRCCommand::trigger
          (MineBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  size_t sVar5;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_100;
  char *local_f8;
  size_t local_e0;
  char *local_d8;
  size_t local_c0;
  char *local_b8;
  size_t local_a0;
  char *local_98;
  Server *server;
  uint i;
  bool match;
  PlayerInfo *player;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  MineBanIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar6 = nick._M_str;
  sVar5 = nick._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  if (bVar1) {
    bVar7 = sv("Error: Too Few Parameters. Syntax: mineban <player>",0x33);
    local_100 = bVar7._M_len;
    local_f8 = bVar7._M_str;
    Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar6,local_100,local_f8);
  }
  else {
    lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar2 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      bVar1 = false;
      server._0_4_ = 0;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if ((uint)server == uVar3) break;
        uVar3 = RenX::getCore();
        pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
        uVar3 = RenX::Server::isLogChanType((int)pPVar4);
        if ((uVar3 & 1) != 0) {
          bVar1 = true;
          lVar2 = RenX::Server::getPlayerByPartName(pPVar4,parameters._M_len,parameters._M_str);
          if (lVar2 == 0) {
            bVar7 = sv("Error: Player not found.",0x18);
            local_c0 = bVar7._M_len;
            local_b8 = bVar7._M_str;
            Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar6,local_c0,local_b8);
          }
          else {
            RenX::Server::mineBan(pPVar4);
            bVar7 = sv("Player can no longer place mines.",0x21);
            local_a0 = bVar7._M_len;
            local_98 = bVar7._M_str;
            Jupiter::IRC::Client::sendMessage
                      (source,channel._M_len,channel._M_str,local_a0,local_98);
          }
        }
        server._0_4_ = (uint)server + 1;
      }
      if (!bVar1) {
        bVar7 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_e0 = bVar7._M_len;
        local_d8 = bVar7._M_str;
        Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar6,local_e0,local_d8);
      }
    }
  }
  return;
}

Assistant:

void MineBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						server->mineBan(*player);
						source->sendMessage(channel, "Player can no longer place mines."sv);
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: mineban <player>"sv);
}